

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::LocalTypes::Set(LocalTypes *this,TypeVector *types)

{
  Type a;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  uint local_28;
  uint local_24;
  Index i;
  Index count;
  Type type;
  TypeVector *types_local;
  LocalTypes *this_local;
  
  type = (Type)types;
  std::
  vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
  ::clear((vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           *)this);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)type);
  if (!bVar1) {
    pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)type,0);
    _i = *pvVar2;
    local_24 = 1;
    for (local_28 = 1;
        sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                          ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)type),
        local_28 < sVar3; local_28 = local_28 + 1) {
      pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)type,(ulong)local_28);
      a.enum_ = pvVar2->enum_;
      a.type_index_ = pvVar2->type_index_;
      bVar1 = wabt::operator!=(a,_i);
      if (bVar1) {
        std::
        vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
        ::emplace_back<wabt::Type&,unsigned_int&>
                  ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                    *)this,(Type *)&i,&local_24);
        pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                           ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)type,(ulong)local_28)
        ;
        _i = *pvVar2;
        local_24 = 1;
      }
      else {
        local_24 = local_24 + 1;
      }
    }
    std::
    vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>::
    emplace_back<wabt::Type&,unsigned_int&>
              ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                *)this,(Type *)&i,&local_24);
  }
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}